

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

void ArrayClear(array *a)

{
  cc_memheap *Heap_00;
  ulong *__ptr;
  cc_memheap *Heap;
  dataheaphead *dp;
  datahead *hp;
  array *a_local;
  
  if (a->_Begin != (char *)0x0) {
    if (a->_Begin == (char *)0x0) {
      __assert_fail("p->_Begin",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/array/array.c"
                    ,0x24,"datahead *Data_Head(const array *)");
    }
    __ptr = (ulong *)(a->_Begin + -0x10);
    if ((*__ptr & 0x8000000000000000) == 0) {
      if ((*__ptr & 0x4000000000000000) == 0) {
        a->_Begin = (char *)0x0;
        a->_Used = 0;
      }
      else {
        free(__ptr);
        a->_Begin = (char *)0x0;
        a->_Used = 0;
      }
    }
    else {
      if (a->_Begin == (char *)0x0) {
        __assert_fail("p->_Begin",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/array/array.c"
                      ,0x1e,"dataheaphead *Data_HeapHead(const array *)");
      }
      Heap_00 = *(cc_memheap **)(a->_Begin + -0x10);
      if ((*__ptr & 0x3fffffffffffffff) != 0) {
        (*Heap_00->Free)(Heap_00,a->_Begin + -0x10,(*__ptr & 0x3fffffffffffffff) + 0x10);
      }
      ArrayInitEx(a,Heap_00);
    }
  }
  return;
}

Assistant:

NOINLINE void ArrayClear(array* a)
{
    if (!a->_Begin)
        return;
    datahead *hp = Data_Head(a);
    if (Data_IsMemHeap(hp))
    {
        dataheaphead *dp = Data_HeapHead(a);
        const struct cc_memheap* Heap = dp->Heap;
        if (Data_GetSize(hp))
            MemHeap_Free(Heap,dp,Data_GetSize(hp)+sizeof(dataheaphead));
        ArrayInitEx(a, Heap);
    }
    else if (Data_IsHeap(hp))
    {
        free(hp);
        a->_Begin = NULL;
        a->_Used = 0;
    }
    else
    {
        a->_Begin = NULL;
        a->_Used = 0;
    }
}